

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O3

bool hasValidLinks(Network *nw)

{
  pointer ppLVar1;
  pointer ppLVar2;
  
  ppLVar1 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar2 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar2 != ppLVar1; ppLVar2 = ppLVar2 + 1) {
    (*((*ppLVar2)->super_Element)._vptr_Element[6])(*ppLVar2,nw);
  }
  return true;
}

Assistant:

bool hasValidLinks(Network* nw)
{
    bool result = true;
    for (Link* link : nw->links)
    {
        try
        {
            link->validate(nw);
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
            result = false;
        }
    }
    return result;
}